

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O1

void __thiscall
mp::NLW2_NLFeeder_C_Impl::FeedUnusedVarNames<mp::StringFileWriter>
          (NLW2_NLFeeder_C_Impl *this,StringFileWriter *wrt)

{
  bool bVar1;
  function<void_(const_char_*)> wrt_c;
  StringFileWriter *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  
  if ((this->nlf2_c_).want_unused_var_names_ != 0) {
    if (wrt->fTriedOpen_ == false) {
      bVar1 = StringFileWriter::Open(wrt);
    }
    else {
      bVar1 = (wrt->nm).f_ != (FILE *)0x0;
    }
    if (bVar1 != false) {
      uStack_30 = 0;
      pcStack_20 = std::
                   _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:438:13)>
                   ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:438:13)>
                 ::_M_manager;
      local_38 = wrt;
      (*(this->nlf2_c_).FeedUnusedVarNames)((this->nlf2_c_).p_user_data_,&local_38);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,3);
      }
    }
  }
  return;
}

Assistant:

void FeedUnusedVarNames(UnusedVarNameWriter& wrt) {
    assert(NLF().FeedUnusedVarNames);
    if (NLF().want_unused_var_names_ && wrt) {
      std::function<void(const char*)> wrt_c
          = [&wrt](const char* name) {
        wrt << name;
      };
      NLF().FeedUnusedVarNames(NLF().p_user_data_, &wrt_c);
    }
  }